

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

btVector3 orth(btVector3 *v)

{
  btVector3 *in_RDI;
  btScalar bVar1;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 b;
  btVector3 a;
  btVector3 *this;
  btScalar local_70;
  btScalar local_6c;
  btScalar local_68;
  btVector3 local_64;
  btScalar local_54 [4];
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btVector3 local_38;
  btScalar local_28 [4];
  btVector3 *local_18;
  btScalar local_10 [4];
  
  local_3c = 0.0;
  local_40 = 0.0;
  local_44 = 1.0;
  this = &local_38;
  local_18 = in_RDI;
  btVector3::btVector3(this,&local_3c,&local_40,&local_44);
  local_28 = (btScalar  [4])btCross(this,in_RDI);
  local_68 = 0.0;
  local_6c = 1.0;
  local_70 = 0.0;
  btVector3::btVector3(&local_64,&local_68,&local_6c,&local_70);
  local_54 = (btScalar  [4])btCross(this,in_RDI);
  bVar1 = btVector3::length((btVector3 *)0x1425c3);
  bVar2 = btVector3::length((btVector3 *)0x1425d3);
  if (bVar1 <= bVar2) {
    local_10 = (btScalar  [4])btVector3::normalized(local_18);
  }
  else {
    local_10 = (btScalar  [4])btVector3::normalized(local_18);
  }
  bVar3.m_floats[0] = local_10[0];
  bVar3.m_floats[1] = local_10[1];
  bVar3.m_floats[2] = local_10[2];
  bVar3.m_floats[3] = local_10[3];
  return (btVector3)bVar3.m_floats;
}

Assistant:

btVector3 orth(const btVector3 &v)
{
	btVector3 a=btCross(v,btVector3(0,0,1));
	btVector3 b=btCross(v,btVector3(0,1,0));
	if (a.length() > b.length())
	{
		return a.normalized();
	} else {
		return b.normalized();
	}
}